

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::Reflection
          (Reflection *this,Descriptor *descriptor,ReflectionSchema *schema,DescriptorPool *pool,
          MessageFactory *factory)

{
  int iVar1;
  DescriptorPool *local_48;
  MessageFactory *factory_local;
  DescriptorPool *pool_local;
  ReflectionSchema *schema_local;
  Descriptor *descriptor_local;
  Reflection *this_local;
  
  this->descriptor_ = descriptor;
  memcpy(&this->schema_,schema,0x48);
  local_48 = pool;
  if (pool == (DescriptorPool *)0x0) {
    local_48 = DescriptorPool::internal_generated_pool();
  }
  this->descriptor_pool_ = local_48;
  this->message_factory_ = factory;
  this->last_non_weak_field_index_ = -1;
  absl::lts_20250127::once_flag::once_flag(&this->tcparse_table_once_);
  this->tcparse_table_ = (TcParseTableBase *)0x0;
  iVar1 = Descriptor::field_count(this->descriptor_);
  this->last_non_weak_field_index_ = iVar1 + -1;
  return;
}

Assistant:

Reflection::Reflection(const Descriptor* descriptor,
                       const internal::ReflectionSchema& schema,
                       const DescriptorPool* pool, MessageFactory* factory)
    : descriptor_(descriptor),
      schema_(schema),
      descriptor_pool_(
          (pool == nullptr) ? DescriptorPool::internal_generated_pool() : pool),
      message_factory_(factory),
      last_non_weak_field_index_(-1) {
  last_non_weak_field_index_ = descriptor_->field_count() - 1;
}